

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O0

int cvRootfind(CVodeMem cv_mem)

{
  double *pdVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined4 uVar5;
  long in_RDI;
  double dVar6;
  int sgnchg;
  int zroot;
  int sideprev;
  int side;
  int imax;
  int retval;
  int i;
  sunrealtype fracsub;
  sunrealtype fracint;
  sunrealtype maxfrac;
  sunrealtype gfrac;
  sunrealtype tmid;
  sunrealtype alph;
  N_Vector local_78;
  N_Vector local_70;
  double local_68;
  int local_54;
  int local_50;
  int local_4c;
  int local_44;
  N_Vector in_stack_ffffffffffffffc0;
  double in_stack_ffffffffffffffc8;
  void *t;
  void *in_stack_ffffffffffffffd8;
  double local_20;
  double local_18;
  int local_4;
  
  local_4c = 0;
  t = (void *)0x0;
  bVar3 = false;
  bVar2 = false;
  for (local_44 = 0; local_44 < *(int *)(in_RDI + 0x568); local_44 = local_44 + 1) {
    if (*(int *)(*(long *)(in_RDI + 0x5d0) + (long)local_44 * 4) != 0) {
      dVar6 = ABS(*(double *)(*(long *)(in_RDI + 0x5a0) + (long)local_44 * 8));
      if ((dVar6 != 0.0) || (NAN(dVar6))) {
        pdVar1 = (double *)(*(long *)(in_RDI + 0x598) + (long)local_44 * 8);
        if (((((*pdVar1 <= 0.0 && *pdVar1 != 0.0) &&
              (0.0 < *(double *)(*(long *)(in_RDI + 0x5a0) + (long)local_44 * 8))) ||
             ((0.0 < *(double *)(*(long *)(in_RDI + 0x598) + (long)local_44 * 8) &&
              (pdVar1 = (double *)(*(long *)(in_RDI + 0x5a0) + (long)local_44 * 8),
              *pdVar1 <= 0.0 && *pdVar1 != 0.0)))) &&
            ((double)*(int *)(*(long *)(in_RDI + 0x578) + (long)local_44 * 4) *
             *(double *)(*(long *)(in_RDI + 0x598) + (long)local_44 * 8) <= 0.0)) &&
           (in_stack_ffffffffffffffd8 =
                 (void *)ABS(*(double *)(*(long *)(in_RDI + 0x5a0) + (long)local_44 * 8) /
                             (*(double *)(*(long *)(in_RDI + 0x5a0) + (long)local_44 * 8) -
                             *(double *)(*(long *)(in_RDI + 0x598) + (long)local_44 * 8))),
           (double)t < (double)in_stack_ffffffffffffffd8)) {
          bVar2 = true;
          local_4c = local_44;
          t = in_stack_ffffffffffffffd8;
        }
      }
      else if ((double)*(int *)(*(long *)(in_RDI + 0x578) + (long)local_44 * 4) *
               *(double *)(*(long *)(in_RDI + 0x598) + (long)local_44 * 8) <= 0.0) {
        bVar3 = true;
      }
    }
  }
  if (!bVar2) {
    *(undefined8 *)(in_RDI + 0x590) = *(undefined8 *)(in_RDI + 0x588);
    for (local_44 = 0; local_44 < *(int *)(in_RDI + 0x568); local_44 = local_44 + 1) {
      *(undefined8 *)(*(long *)(in_RDI + 0x5a8) + (long)local_44 * 8) =
           *(undefined8 *)(*(long *)(in_RDI + 0x5a0) + (long)local_44 * 8);
    }
    if (bVar3) {
      for (local_44 = 0; local_44 < *(int *)(in_RDI + 0x568); local_44 = local_44 + 1) {
        *(undefined4 *)(*(long *)(in_RDI + 0x570) + (long)local_44 * 4) = 0;
        if ((((*(int *)(*(long *)(in_RDI + 0x5d0) + (long)local_44 * 4) != 0) &&
             (dVar6 = ABS(*(double *)(*(long *)(in_RDI + 0x5a0) + (long)local_44 * 8)), dVar6 == 0.0
             )) && (!NAN(dVar6))) &&
           ((double)*(int *)(*(long *)(in_RDI + 0x578) + (long)local_44 * 4) *
            *(double *)(*(long *)(in_RDI + 0x598) + (long)local_44 * 8) <= 0.0)) {
          uVar5 = 1;
          if (0.0 < *(double *)(*(long *)(in_RDI + 0x598) + (long)local_44 * 8)) {
            uVar5 = 0xffffffff;
          }
          *(undefined4 *)(*(long *)(in_RDI + 0x570) + (long)local_44 * 4) = uVar5;
        }
      }
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
    return local_4;
  }
  local_18 = 1.0;
  local_50 = 0;
  local_54 = -1;
  while( true ) {
    while( true ) {
      if (ABS(*(double *)(in_RDI + 0x588) - *(double *)(in_RDI + 0x580)) <=
          *(double *)(in_RDI + 0x5b8)) goto LAB_00115aee;
      if (local_54 == local_50) {
        if (local_50 == 2) {
          local_68 = local_18 * 2.0;
        }
        else {
          local_68 = local_18 * 0.5;
        }
        local_18 = local_68;
      }
      else {
        local_18 = 1.0;
      }
      local_20 = *(double *)(in_RDI + 0x588) -
                 ((*(double *)(in_RDI + 0x588) - *(double *)(in_RDI + 0x580)) *
                 *(double *)(*(long *)(in_RDI + 0x5a0) + (long)local_4c * 8)) /
                 (-local_18 * *(double *)(*(long *)(in_RDI + 0x598) + (long)local_4c * 8) +
                 *(double *)(*(long *)(in_RDI + 0x5a0) + (long)local_4c * 8));
      local_78 = in_stack_ffffffffffffffc0;
      if (ABS(local_20 - *(double *)(in_RDI + 0x580)) < *(double *)(in_RDI + 0x5b8) * 0.5) {
        in_stack_ffffffffffffffc8 =
             ABS(*(double *)(in_RDI + 0x588) - *(double *)(in_RDI + 0x580)) /
             *(double *)(in_RDI + 0x5b8);
        if (in_stack_ffffffffffffffc8 <= 5.0) {
          local_70 = (N_Vector)(0.5 / in_stack_ffffffffffffffc8);
        }
        else {
          local_70 = (N_Vector)&DAT_3fb999999999999a;
        }
        local_20 = (double)local_70 * (*(double *)(in_RDI + 0x588) - *(double *)(in_RDI + 0x580)) +
                   *(double *)(in_RDI + 0x580);
        local_78 = local_70;
      }
      if (ABS(*(double *)(in_RDI + 0x588) - local_20) < *(double *)(in_RDI + 0x5b8) * 0.5) {
        in_stack_ffffffffffffffc8 =
             ABS(*(double *)(in_RDI + 0x588) - *(double *)(in_RDI + 0x580)) /
             *(double *)(in_RDI + 0x5b8);
        if (in_stack_ffffffffffffffc8 <= 5.0) {
          local_78 = (N_Vector)(0.5 / in_stack_ffffffffffffffc8);
        }
        else {
          local_78 = (N_Vector)&DAT_3fb999999999999a;
        }
        local_20 = -(double)local_78 * (*(double *)(in_RDI + 0x588) - *(double *)(in_RDI + 0x580)) +
                   *(double *)(in_RDI + 0x588);
      }
      CVodeGetDky(in_stack_ffffffffffffffd8,(sunrealtype)t,
                  (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),local_78);
      iVar4 = (**(code **)(in_RDI + 0x560))
                        (local_20,*(undefined8 *)(in_RDI + 0xd0),*(undefined8 *)(in_RDI + 0x5a8),
                         *(undefined8 *)(in_RDI + 0x18));
      *(long *)(in_RDI + 0x5c8) = *(long *)(in_RDI + 0x5c8) + 1;
      if (iVar4 != 0) {
        return -0xc;
      }
      t = (void *)0x0;
      bVar3 = false;
      bVar2 = false;
      local_54 = local_50;
      for (local_44 = 0; local_44 < *(int *)(in_RDI + 0x568); local_44 = local_44 + 1) {
        if (*(int *)(*(long *)(in_RDI + 0x5d0) + (long)local_44 * 4) != 0) {
          dVar6 = ABS(*(double *)(*(long *)(in_RDI + 0x5a8) + (long)local_44 * 8));
          if ((dVar6 != 0.0) || (NAN(dVar6))) {
            pdVar1 = (double *)(*(long *)(in_RDI + 0x598) + (long)local_44 * 8);
            if ((((*pdVar1 <= 0.0 && *pdVar1 != 0.0) &&
                 (0.0 < *(double *)(*(long *)(in_RDI + 0x5a8) + (long)local_44 * 8))) ||
                ((0.0 < *(double *)(*(long *)(in_RDI + 0x598) + (long)local_44 * 8) &&
                 (pdVar1 = (double *)(*(long *)(in_RDI + 0x5a8) + (long)local_44 * 8),
                 *pdVar1 <= 0.0 && *pdVar1 != 0.0)))) &&
               (((double)*(int *)(*(long *)(in_RDI + 0x578) + (long)local_44 * 4) *
                 *(double *)(*(long *)(in_RDI + 0x598) + (long)local_44 * 8) <= 0.0 &&
                (in_stack_ffffffffffffffd8 =
                      (void *)ABS(*(double *)(*(long *)(in_RDI + 0x5a8) + (long)local_44 * 8) /
                                  (*(double *)(*(long *)(in_RDI + 0x5a8) + (long)local_44 * 8) -
                                  *(double *)(*(long *)(in_RDI + 0x598) + (long)local_44 * 8))),
                (double)t < (double)in_stack_ffffffffffffffd8)))) {
              bVar2 = true;
              local_4c = local_44;
              t = in_stack_ffffffffffffffd8;
            }
          }
          else if ((double)*(int *)(*(long *)(in_RDI + 0x578) + (long)local_44 * 4) *
                   *(double *)(*(long *)(in_RDI + 0x598) + (long)local_44 * 8) <= 0.0) {
            bVar3 = true;
          }
        }
      }
      in_stack_ffffffffffffffc0 = local_78;
      if (!bVar2) break;
      *(double *)(in_RDI + 0x588) = local_20;
      for (local_44 = 0; local_44 < *(int *)(in_RDI + 0x568); local_44 = local_44 + 1) {
        *(undefined8 *)(*(long *)(in_RDI + 0x5a0) + (long)local_44 * 8) =
             *(undefined8 *)(*(long *)(in_RDI + 0x5a8) + (long)local_44 * 8);
      }
      local_50 = 1;
      if (ABS(*(double *)(in_RDI + 0x588) - *(double *)(in_RDI + 0x580)) <=
          *(double *)(in_RDI + 0x5b8)) goto LAB_00115aee;
    }
    if (bVar3) break;
    *(double *)(in_RDI + 0x580) = local_20;
    for (local_44 = 0; local_44 < *(int *)(in_RDI + 0x568); local_44 = local_44 + 1) {
      *(undefined8 *)(*(long *)(in_RDI + 0x598) + (long)local_44 * 8) =
           *(undefined8 *)(*(long *)(in_RDI + 0x5a8) + (long)local_44 * 8);
    }
    local_50 = 2;
    if (ABS(*(double *)(in_RDI + 0x588) - *(double *)(in_RDI + 0x580)) <=
        *(double *)(in_RDI + 0x5b8)) goto LAB_00115aee;
  }
  *(double *)(in_RDI + 0x588) = local_20;
  for (local_44 = 0; local_44 < *(int *)(in_RDI + 0x568); local_44 = local_44 + 1) {
    *(undefined8 *)(*(long *)(in_RDI + 0x5a0) + (long)local_44 * 8) =
         *(undefined8 *)(*(long *)(in_RDI + 0x5a8) + (long)local_44 * 8);
  }
LAB_00115aee:
  *(undefined8 *)(in_RDI + 0x590) = *(undefined8 *)(in_RDI + 0x588);
  for (local_44 = 0; local_44 < *(int *)(in_RDI + 0x568); local_44 = local_44 + 1) {
    *(undefined8 *)(*(long *)(in_RDI + 0x5a8) + (long)local_44 * 8) =
         *(undefined8 *)(*(long *)(in_RDI + 0x5a0) + (long)local_44 * 8);
    *(undefined4 *)(*(long *)(in_RDI + 0x570) + (long)local_44 * 4) = 0;
    if (*(int *)(*(long *)(in_RDI + 0x5d0) + (long)local_44 * 4) != 0) {
      dVar6 = ABS(*(double *)(*(long *)(in_RDI + 0x5a0) + (long)local_44 * 8));
      if (((dVar6 == 0.0) && (!NAN(dVar6))) &&
         ((double)*(int *)(*(long *)(in_RDI + 0x578) + (long)local_44 * 4) *
          *(double *)(*(long *)(in_RDI + 0x598) + (long)local_44 * 8) <= 0.0)) {
        uVar5 = 1;
        if (0.0 < *(double *)(*(long *)(in_RDI + 0x598) + (long)local_44 * 8)) {
          uVar5 = 0xffffffff;
        }
        *(undefined4 *)(*(long *)(in_RDI + 0x570) + (long)local_44 * 4) = uVar5;
      }
      pdVar1 = (double *)(*(long *)(in_RDI + 0x598) + (long)local_44 * 8);
      if ((((*pdVar1 <= 0.0 && *pdVar1 != 0.0) &&
           (0.0 < *(double *)(*(long *)(in_RDI + 0x5a0) + (long)local_44 * 8))) ||
          ((0.0 < *(double *)(*(long *)(in_RDI + 0x598) + (long)local_44 * 8) &&
           (pdVar1 = (double *)(*(long *)(in_RDI + 0x5a0) + (long)local_44 * 8),
           *pdVar1 <= 0.0 && *pdVar1 != 0.0)))) &&
         ((double)*(int *)(*(long *)(in_RDI + 0x578) + (long)local_44 * 4) *
          *(double *)(*(long *)(in_RDI + 0x598) + (long)local_44 * 8) <= 0.0)) {
        uVar5 = 1;
        if (0.0 < *(double *)(*(long *)(in_RDI + 0x598) + (long)local_44 * 8)) {
          uVar5 = 0xffffffff;
        }
        *(undefined4 *)(*(long *)(in_RDI + 0x570) + (long)local_44 * 4) = uVar5;
      }
    }
  }
  return 1;
}

Assistant:

static int cvRootfind(CVodeMem cv_mem)
{
  sunrealtype alph, tmid, gfrac, maxfrac, fracint, fracsub;
  int i, retval, imax, side, sideprev;
  sunbooleantype zroot, sgnchg;

  imax = 0;

  /* First check for change in sign in ghi or for a zero in ghi. */
  maxfrac = ZERO;
  zroot   = SUNFALSE;
  sgnchg  = SUNFALSE;
  for (i = 0; i < cv_mem->cv_nrtfn; i++)
  {
    if (!cv_mem->cv_gactive[i]) { continue; }
    if (SUNRabs(cv_mem->cv_ghi[i]) == ZERO)
    {
      if (cv_mem->cv_rootdir[i] * cv_mem->cv_glo[i] <= ZERO)
      {
        zroot = SUNTRUE;
      }
    }
    else
    {
      if ((DIFFERENT_SIGN(cv_mem->cv_glo[i], cv_mem->cv_ghi[i])) &&
          (cv_mem->cv_rootdir[i] * cv_mem->cv_glo[i] <= ZERO))
      {
        gfrac =
          SUNRabs(cv_mem->cv_ghi[i] / (cv_mem->cv_ghi[i] - cv_mem->cv_glo[i]));
        if (gfrac > maxfrac)
        {
          sgnchg  = SUNTRUE;
          maxfrac = gfrac;
          imax    = i;
        }
      }
    }
  }

  /* If no sign change was found, reset trout and grout.  Then return
     CV_SUCCESS if no zero was found, or set iroots and return RTFOUND.  */
  if (!sgnchg)
  {
    cv_mem->cv_trout = cv_mem->cv_thi;
    for (i = 0; i < cv_mem->cv_nrtfn; i++)
    {
      cv_mem->cv_grout[i] = cv_mem->cv_ghi[i];
    }
    if (!zroot) { return (CV_SUCCESS); }
    for (i = 0; i < cv_mem->cv_nrtfn; i++)
    {
      cv_mem->cv_iroots[i] = 0;
      if (!cv_mem->cv_gactive[i]) { continue; }
      if ((SUNRabs(cv_mem->cv_ghi[i]) == ZERO) &&
          (cv_mem->cv_rootdir[i] * cv_mem->cv_glo[i] <= ZERO))
      {
        cv_mem->cv_iroots[i] = cv_mem->cv_glo[i] > 0 ? -1 : 1;
      }
    }
    return (RTFOUND);
  }

  /* Initialize alph to avoid compiler warning */
  alph = ONE;

  /* A sign change was found.  Loop to locate nearest root. */

  side     = 0;
  sideprev = -1;
  for (;;)
  { /* Looping point */

    /* If interval size is already less than tolerance ttol, break. */
    if (SUNRabs(cv_mem->cv_thi - cv_mem->cv_tlo) <= cv_mem->cv_ttol) { break; }

    /* Set weight alph.
       On the first two passes, set alph = 1.  Thereafter, reset alph
       according to the side (low vs high) of the subinterval in which
       the sign change was found in the previous two passes.
       If the sides were opposite, set alph = 1.
       If the sides were the same, then double alph (if high side),
       or halve alph (if low side).
       The next guess tmid is the secant method value if alph = 1, but
       is closer to tlo if alph < 1, and closer to thi if alph > 1.    */

    if (sideprev == side) { alph = (side == 2) ? alph * TWO : alph * HALF; }
    else { alph = ONE; }

    /* Set next root approximation tmid and get g(tmid).
       If tmid is too close to tlo or thi, adjust it inward,
       by a fractional distance that is between 0.1 and 0.5.  */
    tmid = cv_mem->cv_thi -
           (cv_mem->cv_thi - cv_mem->cv_tlo) * cv_mem->cv_ghi[imax] /
             (cv_mem->cv_ghi[imax] - alph * cv_mem->cv_glo[imax]);
    if (SUNRabs(tmid - cv_mem->cv_tlo) < HALF * cv_mem->cv_ttol)
    {
      fracint = SUNRabs(cv_mem->cv_thi - cv_mem->cv_tlo) / cv_mem->cv_ttol;
      fracsub = (fracint > FIVE) ? PT1 : HALF / fracint;
      tmid    = cv_mem->cv_tlo + fracsub * (cv_mem->cv_thi - cv_mem->cv_tlo);
    }
    if (SUNRabs(cv_mem->cv_thi - tmid) < HALF * cv_mem->cv_ttol)
    {
      fracint = SUNRabs(cv_mem->cv_thi - cv_mem->cv_tlo) / cv_mem->cv_ttol;
      fracsub = (fracint > FIVE) ? PT1 : HALF / fracint;
      tmid    = cv_mem->cv_thi - fracsub * (cv_mem->cv_thi - cv_mem->cv_tlo);
    }

    (void)CVodeGetDky(cv_mem, tmid, 0, cv_mem->cv_y);
    retval = cv_mem->cv_gfun(tmid, cv_mem->cv_y, cv_mem->cv_grout,
                             cv_mem->cv_user_data);
    cv_mem->cv_nge++;
    if (retval != 0) { return (CV_RTFUNC_FAIL); }

    /* Check to see in which subinterval g changes sign, and reset imax.
       Set side = 1 if sign change is on low side, or 2 if on high side.  */
    maxfrac  = ZERO;
    zroot    = SUNFALSE;
    sgnchg   = SUNFALSE;
    sideprev = side;
    for (i = 0; i < cv_mem->cv_nrtfn; i++)
    {
      if (!cv_mem->cv_gactive[i]) { continue; }
      if (SUNRabs(cv_mem->cv_grout[i]) == ZERO)
      {
        if (cv_mem->cv_rootdir[i] * cv_mem->cv_glo[i] <= ZERO)
        {
          zroot = SUNTRUE;
        }
      }
      else
      {
        if ((DIFFERENT_SIGN(cv_mem->cv_glo[i], cv_mem->cv_grout[i])) &&
            (cv_mem->cv_rootdir[i] * cv_mem->cv_glo[i] <= ZERO))
        {
          gfrac = SUNRabs(cv_mem->cv_grout[i] /
                          (cv_mem->cv_grout[i] - cv_mem->cv_glo[i]));
          if (gfrac > maxfrac)
          {
            sgnchg  = SUNTRUE;
            maxfrac = gfrac;
            imax    = i;
          }
        }
      }
    }
    if (sgnchg)
    {
      /* Sign change found in (tlo,tmid); replace thi with tmid. */
      cv_mem->cv_thi = tmid;
      for (i = 0; i < cv_mem->cv_nrtfn; i++)
      {
        cv_mem->cv_ghi[i] = cv_mem->cv_grout[i];
      }
      side = 1;
      /* Stop at root thi if converged; otherwise loop. */
      if (SUNRabs(cv_mem->cv_thi - cv_mem->cv_tlo) <= cv_mem->cv_ttol)
      {
        break;
      }
      continue; /* Return to looping point. */
    }

    if (zroot)
    {
      /* No sign change in (tlo,tmid), but g = 0 at tmid; return root tmid. */
      cv_mem->cv_thi = tmid;
      for (i = 0; i < cv_mem->cv_nrtfn; i++)
      {
        cv_mem->cv_ghi[i] = cv_mem->cv_grout[i];
      }
      break;
    }

    /* No sign change in (tlo,tmid), and no zero at tmid.
       Sign change must be in (tmid,thi).  Replace tlo with tmid. */
    cv_mem->cv_tlo = tmid;
    for (i = 0; i < cv_mem->cv_nrtfn; i++)
    {
      cv_mem->cv_glo[i] = cv_mem->cv_grout[i];
    }
    side = 2;
    /* Stop at root thi if converged; otherwise loop back. */
    if (SUNRabs(cv_mem->cv_thi - cv_mem->cv_tlo) <= cv_mem->cv_ttol) { break; }

  } /* End of root-search loop */

  /* Reset trout and grout, set iroots, and return RTFOUND. */
  cv_mem->cv_trout = cv_mem->cv_thi;
  for (i = 0; i < cv_mem->cv_nrtfn; i++)
  {
    cv_mem->cv_grout[i]  = cv_mem->cv_ghi[i];
    cv_mem->cv_iroots[i] = 0;
    if (!cv_mem->cv_gactive[i]) { continue; }
    if ((SUNRabs(cv_mem->cv_ghi[i]) == ZERO) &&
        (cv_mem->cv_rootdir[i] * cv_mem->cv_glo[i] <= ZERO))
    {
      cv_mem->cv_iroots[i] = cv_mem->cv_glo[i] > 0 ? -1 : 1;
    }
    if ((DIFFERENT_SIGN(cv_mem->cv_glo[i], cv_mem->cv_ghi[i])) &&
        (cv_mem->cv_rootdir[i] * cv_mem->cv_glo[i] <= ZERO))
    {
      cv_mem->cv_iroots[i] = cv_mem->cv_glo[i] > 0 ? -1 : 1;
    }
  }
  return (RTFOUND);
}